

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

bool common_download_file_single(string *url,string *path,string *bearer_token)

{
  _Alloc_hider _Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined7 extraout_var;
  common_log *pcVar5;
  reference pvVar6;
  tuple<_IO_FILE_*,_FILE_deleter> tVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  int max_attempts;
  int extraout_EDX;
  int extraout_EDX_00;
  char *fmt;
  byte bVar11;
  ulong uVar12;
  pointer __old_p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  curl_ptr curl;
  json metadata;
  curl_slist_ptr http_headers;
  unique_ptr<_IO_FILE,_FILE_deleter> outfile;
  common_load_model_from_url_headers headers;
  long http_code_1;
  string path_temporary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [2];
  string metadata_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string last_modified;
  string etag;
  string auth_header;
  int aiStack_218 [122];
  
  curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>._M_head_impl
       = (void *)curl_easy_init();
  curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)curl_easy_cleanup;
  http_headers.ptr = (curl_slist *)0x0;
  if (curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
      _M_head_impl == (void *)0x0) {
    if (common_log_verbosity_thold < 0) {
      bVar2 = false;
    }
    else {
      pcVar5 = common_log_main();
      bVar2 = false;
      common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: error initializing libcurl\n",
                     "common_download_file_single");
    }
    goto LAB_00142a79;
  }
  curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2712,(url->_M_dataplus)._M_p)
  ;
  curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_void_*,_false>._M_head_impl,0x34,1);
  http_headers.ptr = (curl_slist *)curl_slist_append(http_headers.ptr,"User-Agent: llama-cpp");
  if (bearer_token->_M_string_length != 0) {
    std::operator+(&auth_header,"Authorization: Bearer ",bearer_token);
    http_headers.ptr =
         (curl_slist *)curl_slist_append(http_headers.ptr,auth_header._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&auth_header);
  }
  curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2727,http_headers.ptr);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&auth_header,path,auto_format);
  bVar2 = std::filesystem::exists((path *)&auth_header);
  uVar12 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  std::filesystem::__cxx11::path::~path((path *)&auth_header);
  std::operator+(&metadata_path,path,".json");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(&metadata,(nullptr_t)0x0);
  etag._M_dataplus._M_p = (pointer)&etag.field_2;
  etag._M_string_length = 0;
  last_modified._M_dataplus._M_p = (pointer)&last_modified.field_2;
  last_modified._M_string_length = 0;
  etag.field_2._M_local_buf[0] = '\0';
  last_modified.field_2._M_local_buf[0] = '\0';
  bVar11 = (byte)uVar12;
  if (bVar11 == 0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar5 = common_log_main();
      common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,"%s: no previous model file found %s\n",
                     "common_download_file_single",(path->_M_dataplus)._M_p);
    }
LAB_0014233d:
    headers.etag._M_dataplus._M_p = (pointer)&headers.etag.field_2;
    headers.etag._M_string_length = 0;
    iVar10 = 0;
    headers.etag.field_2._M_local_buf[0] = '\0';
    headers.last_modified._M_dataplus._M_p = (pointer)&headers.last_modified.field_2;
    headers.last_modified._M_string_length = 0;
    headers.last_modified.field_2._M_local_buf[0] = '\0';
    curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2c,1);
    curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2b,1);
    curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_void_*,_false>._M_head_impl,0x4e6f,
                     common_download_file_single::anon_class_1_0_00000001::__invoke);
    curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_void_*,_false>._M_head_impl,0x272d,&headers);
    bVar2 = curl_perform_with_retry
                      (url,curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_void_*,_false>._M_head_impl,max_attempts,iVar10);
    if (bVar2) {
      auth_header._M_dataplus._M_p = (pointer)0x0;
      curl_easy_getinfo(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_void_*,_false>._M_head_impl,0x200002);
      if ((auth_header._M_dataplus._M_p != (pointer)0xc8) && (-1 < common_log_verbosity_thold)) {
        pcVar5 = common_log_main();
        iVar10 = 0x1d3d1d;
        common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                       "%s: HEAD invalid http status code received: %ld\n",
                       "common_download_file_single",auth_header._M_dataplus._M_p);
LAB_001424de:
        std::operator+(&path_temporary,path,".downloadInProgress");
        if (bVar11 == 0) {
LAB_0014255d:
          tVar7.super__Tuple_impl<0UL,__IO_FILE_*,_FILE_deleter>.
          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,__IO_FILE_*,_FILE_deleter>)
               fopen(path_temporary._M_dataplus._M_p,"wb");
          outfile._M_t.super___uniq_ptr_impl<_IO_FILE,_FILE_deleter>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_FILE_deleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
          _M_head_impl = (__uniq_ptr_data<_IO_FILE,_FILE_deleter,_true,_true>)
                         (__uniq_ptr_data<_IO_FILE,_FILE_deleter,_true,_true>)
                         tVar7.super__Tuple_impl<0UL,__IO_FILE_*,_FILE_deleter>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
          if (tVar7.super__Tuple_impl<0UL,__IO_FILE_*,_FILE_deleter>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl ==
              (_Head_base<0UL,__IO_FILE_*,_false>)0x0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar5 = common_log_main();
              common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                             "%s: error opening local file for writing: %s\n",
                             "common_download_file_single",(path->_M_dataplus)._M_p);
            }
          }
          else {
            curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2c,0);
            curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_void_*,_false>._M_head_impl,0x4e2b,
                             common_download_file_single::anon_class_1_0_00000001::__invoke);
            curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2711,
                             tVar7.super__Tuple_impl<0UL,__IO_FILE_*,_FILE_deleter>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
            curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2b,0);
            iVar4 = extraout_EDX;
            if (-1 < common_log_verbosity_thold) {
              pcVar5 = common_log_main();
              lVar8 = std::__cxx11::string::find((char *)url,0x1dfc3c);
              if ((lVar8 == -1) || (lVar8 = std::__cxx11::string::find((char)url,0x40), lVar8 == -1)
                 ) {
                std::__cxx11::string::string((string *)&local_2d8,(string *)url);
              }
              else {
                std::__cxx11::string::substr((ulong)local_338,(ulong)url);
                std::operator+(&auth_header,local_338,"********");
                std::__cxx11::string::substr((ulong)&local_2a8,(ulong)url);
                std::operator+(&local_2d8,&auth_header,&local_2a8);
                std::__cxx11::string::~string((string *)&local_2a8);
                std::__cxx11::string::~string((string *)&auth_header);
                std::__cxx11::string::~string((string *)local_338);
              }
              _Var1._M_p = headers.last_modified._M_dataplus._M_p;
              common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,
                             "%s: trying to download model from %s to %s (server_etag:%s, server_last_modified:%s)...\n"
                             ,"common_download_file_single",local_2d8._M_dataplus._M_p,
                             (path->_M_dataplus)._M_p,headers.etag._M_dataplus._M_p);
              iVar10 = (int)_Var1._M_p;
              std::__cxx11::string::~string((string *)&local_2d8);
              iVar4 = extraout_EDX_00;
            }
            bVar2 = curl_perform_with_retry
                              (url,curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                                   super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_void_*,_false>._M_head_impl,iVar4,iVar10);
            if ((bVar2) &&
               (curl_easy_getinfo(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_void_*,_false>._M_head_impl,0x200002),
               -1 < common_log_verbosity_thold)) {
              pcVar5 = common_log_main();
              common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                             "%s: invalid http status code received: %ld\n",
                             "common_download_file_single",0);
            }
          }
          std::unique_ptr<_IO_FILE,_FILE_deleter>::~unique_ptr(&outfile);
        }
        else {
          if (-1 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            iVar10 = 0x1d3d1d;
            common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,"%s: deleting previous downloaded file: %s\n",
                           "common_download_file_single",(path->_M_dataplus)._M_p);
          }
          iVar4 = remove((path->_M_dataplus)._M_p);
          if (iVar4 == 0) goto LAB_0014255d;
          if (-1 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: unable to delete file: %s\n",
                           "common_download_file_single",(path->_M_dataplus)._M_p);
          }
        }
        std::__cxx11::string::~string((string *)&path_temporary);
        goto LAB_00142a3b;
      }
      bVar9 = bVar11 ^ 1 | auth_header._M_dataplus._M_p != (pointer)0xc8;
      iVar10 = (int)CONCAT71((int7)(uVar12 >> 8),bVar9);
      if (bVar9 != 0) goto LAB_001424de;
      if (etag._M_string_length != 0) {
        __lhs = &etag;
        bVar2 = std::operator!=(__lhs,&headers.etag);
        if (!bVar2) goto LAB_00142480;
        if (common_log_verbosity_thold < 0) goto LAB_001424de;
        pcVar5 = common_log_main();
        fmt = "%s: ETag header is different (%s != %s): triggering a new download\n";
LAB_001424c6:
        iVar10 = 0x1d3d1d;
        common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,fmt,"common_download_file_single",
                       (__lhs->_M_dataplus)._M_p);
        goto LAB_001424de;
      }
LAB_00142480:
      bVar2 = true;
      if (last_modified._M_string_length != 0) {
        __lhs = &last_modified;
        bVar3 = std::operator!=(__lhs,&headers.last_modified);
        if (bVar3) {
          if (common_log_verbosity_thold < 0) goto LAB_001424de;
          pcVar5 = common_log_main();
          fmt = "%s: Last-Modified header is different (%s != %s): triggering a new download\n";
          goto LAB_001424c6;
        }
      }
    }
    else {
LAB_00142a3b:
      bVar2 = false;
    }
    common_download_file_single::common_load_model_from_url_headers::
    ~common_load_model_from_url_headers(&headers);
  }
  else {
    std::ifstream::ifstream(&auth_header,(string *)&metadata_path,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(auth_header._M_dataplus._M_p + -0x18)) != 0) {
LAB_00142330:
      std::ifstream::~ifstream(&auth_header);
      goto LAB_0014233d;
    }
    nlohmann::json_abi_v3_11_3::operator>>((istream *)&auth_header,&metadata);
    if (-1 < common_log_verbosity_thold) {
      pcVar5 = common_log_main();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&headers.etag,&metadata,-1,' ',false,strict);
      common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,"%s: previous metadata file found %s: %s\n",
                     "common_download_file_single",metadata_path._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&headers);
    }
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[4],_0>(&metadata,(char (*) [4])0x1cffbb);
    if ((!bVar2) ||
       (pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[4],_0>(&metadata,(char (*) [4])0x1cffbb),
       (pvVar6->m_data).m_type != string)) {
LAB_00142264:
      bVar2 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[5],_0>(&metadata,(char (*) [5])"etag");
      if ((bVar2) &&
         (pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::at<const_char_(&)[5],_0>(&metadata,(char (*) [5])"etag"),
         (pvVar6->m_data).m_type == string)) {
        pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[5],_0>(&metadata,(char (*) [5])"etag");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&headers,pvVar6);
        std::__cxx11::string::operator=((string *)&etag,(string *)&headers);
        std::__cxx11::string::~string((string *)&headers);
      }
      bVar2 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[13],_0>(&metadata,(char (*) [13])"lastModified");
      if ((bVar2) &&
         (pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::at<const_char_(&)[13],_0>(&metadata,(char (*) [13])"lastModified"),
         (pvVar6->m_data).m_type == string)) {
        pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[13],_0>(&metadata,(char (*) [13])"lastModified");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&headers,pvVar6);
        std::__cxx11::string::operator=((string *)&last_modified,(string *)&headers);
        std::__cxx11::string::~string((string *)&headers);
      }
      goto LAB_00142330;
    }
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::at<const_char_(&)[4],_0>(&metadata,(char (*) [4])0x1cffbb);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&headers,pvVar6);
    bVar2 = std::operator!=(&headers.etag,url);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&headers);
      goto LAB_00142264;
    }
    if (-1 < common_log_verbosity_thold) {
      pcVar5 = common_log_main();
      common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: Model URL mismatch: %s != %s\n",
                     "common_download_file_single",(url->_M_dataplus)._M_p,
                     headers.etag._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&headers);
    std::ifstream::~ifstream(&auth_header);
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&last_modified);
  std::__cxx11::string::~string((string *)&etag);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&metadata);
  std::__cxx11::string::~string((string *)&metadata_path);
LAB_00142a79:
  curl_slist_ptr::~curl_slist_ptr(&http_headers);
  std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr(&curl);
  return bVar2;
}

Assistant:

static bool common_download_file_single(const std::string & url, const std::string & path, const std::string & bearer_token) {
    // Initialize libcurl
    curl_ptr       curl(curl_easy_init(), &curl_easy_cleanup);
    curl_slist_ptr http_headers;
    if (!curl) {
        LOG_ERR("%s: error initializing libcurl\n", __func__);
        return false;
    }

    bool force_download = false;

    // Set the URL, allow to follow http redirection
    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_FOLLOWLOCATION, 1L);

    http_headers.ptr = curl_slist_append(http_headers.ptr, "User-Agent: llama-cpp");
    // Check if hf-token or bearer-token was specified
    if (!bearer_token.empty()) {
        std::string auth_header = "Authorization: Bearer " + bearer_token;
        http_headers.ptr = curl_slist_append(http_headers.ptr, auth_header.c_str());
    }
    curl_easy_setopt(curl.get(), CURLOPT_HTTPHEADER, http_headers.ptr);

#if defined(_WIN32)
    // CURLSSLOPT_NATIVE_CA tells libcurl to use standard certificate store of
    //   operating system. Currently implemented under MS-Windows.
    curl_easy_setopt(curl.get(), CURLOPT_SSL_OPTIONS, CURLSSLOPT_NATIVE_CA);
#endif

    // Check if the file already exists locally
    auto file_exists = std::filesystem::exists(path);

    // If the file exists, check its JSON metadata companion file.
    std::string metadata_path = path + ".json";
    nlohmann::json metadata;
    std::string etag;
    std::string last_modified;

    if (file_exists) {
        // Try and read the JSON metadata file (note: stream autoclosed upon exiting this block).
        std::ifstream metadata_in(metadata_path);
        if (metadata_in.good()) {
            try {
                metadata_in >> metadata;
                LOG_INF("%s: previous metadata file found %s: %s\n", __func__, metadata_path.c_str(), metadata.dump().c_str());
                if (metadata.contains("url") && metadata.at("url").is_string()) {
                    auto previous_url = metadata.at("url").get<std::string>();
                    if (previous_url != url) {
                        LOG_ERR("%s: Model URL mismatch: %s != %s\n", __func__, url.c_str(), previous_url.c_str());
                        return false;
                    }
                }
                if (metadata.contains("etag") && metadata.at("etag").is_string()) {
                    etag = metadata.at("etag");
                }
                if (metadata.contains("lastModified") && metadata.at("lastModified").is_string()) {
                    last_modified = metadata.at("lastModified");
                }
            } catch (const nlohmann::json::exception & e) {
            LOG_ERR("%s: error reading metadata file %s: %s\n", __func__, metadata_path.c_str(), e.what());
                return false;
            }
        }
    } else {
        LOG_INF("%s: no previous model file found %s\n", __func__, path.c_str());
    }

    // Send a HEAD request to retrieve the etag and last-modified headers
    struct common_load_model_from_url_headers {
        std::string etag;
        std::string last_modified;
    };

    common_load_model_from_url_headers headers;

    {
        typedef size_t(*CURLOPT_HEADERFUNCTION_PTR)(char *, size_t, size_t, void *);
        auto header_callback = [](char * buffer, size_t /*size*/, size_t n_items, void * userdata) -> size_t {
            common_load_model_from_url_headers * headers = (common_load_model_from_url_headers *) userdata;

            static std::regex header_regex("([^:]+): (.*)\r\n");
            static std::regex etag_regex("ETag", std::regex_constants::icase);
            static std::regex last_modified_regex("Last-Modified", std::regex_constants::icase);

            std::string header(buffer, n_items);
            std::smatch match;
            if (std::regex_match(header, match, header_regex)) {
                const std::string & key = match[1];
                const std::string & value = match[2];
                if (std::regex_match(key, match, etag_regex)) {
                    headers->etag = value;
                } else if (std::regex_match(key, match, last_modified_regex)) {
                    headers->last_modified = value;
                }
            }
            return n_items;
        };

        curl_easy_setopt(curl.get(), CURLOPT_NOBODY, 1L); // will trigger the HEAD verb
        curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 1L); // hide head request progress
        curl_easy_setopt(curl.get(), CURLOPT_HEADERFUNCTION, static_cast<CURLOPT_HEADERFUNCTION_PTR>(header_callback));
        curl_easy_setopt(curl.get(), CURLOPT_HEADERDATA, &headers);

        bool was_perform_successful = curl_perform_with_retry(url, curl.get(), CURL_MAX_RETRY, CURL_RETRY_DELAY_SECONDS);
        if (!was_perform_successful) {
            return false;
        }

        long http_code = 0;
        curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &http_code);
        if (http_code != 200) {
            // HEAD not supported, we don't know if the file has changed
            // force trigger downloading
            force_download = true;
            LOG_ERR("%s: HEAD invalid http status code received: %ld\n", __func__, http_code);
        }
    }

    bool should_download = !file_exists || force_download;
    if (!should_download) {
        if (!etag.empty() && etag != headers.etag) {
            LOG_WRN("%s: ETag header is different (%s != %s): triggering a new download\n", __func__, etag.c_str(), headers.etag.c_str());
            should_download = true;
        } else if (!last_modified.empty() && last_modified != headers.last_modified) {
            LOG_WRN("%s: Last-Modified header is different (%s != %s): triggering a new download\n", __func__, last_modified.c_str(), headers.last_modified.c_str());
            should_download = true;
        }
    }
    if (should_download) {
        std::string path_temporary = path + ".downloadInProgress";
        if (file_exists) {
            LOG_WRN("%s: deleting previous downloaded file: %s\n", __func__, path.c_str());
            if (remove(path.c_str()) != 0) {
                LOG_ERR("%s: unable to delete file: %s\n", __func__, path.c_str());
                return false;
            }
        }

        // Set the output file

        struct FILE_deleter {
            void operator()(FILE * f) const {
                fclose(f);
            }
        };

        std::unique_ptr<FILE, FILE_deleter> outfile(fopen(path_temporary.c_str(), "wb"));
        if (!outfile) {
            LOG_ERR("%s: error opening local file for writing: %s\n", __func__, path.c_str());
            return false;
        }

        typedef size_t(*CURLOPT_WRITEFUNCTION_PTR)(void * data, size_t size, size_t nmemb, void * fd);
        auto write_callback = [](void * data, size_t size, size_t nmemb, void * fd) -> size_t {
            return fwrite(data, size, nmemb, (FILE *)fd);
        };
        curl_easy_setopt(curl.get(), CURLOPT_NOBODY, 0L);
        curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, static_cast<CURLOPT_WRITEFUNCTION_PTR>(write_callback));
        curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, outfile.get());

        //  display download progress
        curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 0L);

        // helper function to hide password in URL
        auto llama_download_hide_password_in_url = [](const std::string & url) -> std::string {
            std::size_t protocol_pos = url.find("://");
            if (protocol_pos == std::string::npos) {
                return url;  // Malformed URL
            }

            std::size_t at_pos = url.find('@', protocol_pos + 3);
            if (at_pos == std::string::npos) {
                return url;  // No password in URL
            }

            return url.substr(0, protocol_pos + 3) + "********" + url.substr(at_pos);
        };

        // start the download
        LOG_INF("%s: trying to download model from %s to %s (server_etag:%s, server_last_modified:%s)...\n", __func__,
            llama_download_hide_password_in_url(url).c_str(), path.c_str(), headers.etag.c_str(), headers.last_modified.c_str());
        bool was_perform_successful = curl_perform_with_retry(url, curl.get(), CURL_MAX_RETRY, CURL_RETRY_DELAY_SECONDS);
        if (!was_perform_successful) {
            return false;
        }

        long http_code = 0;
        curl_easy_getinfo (curl.get(), CURLINFO_RESPONSE_CODE, &http_code);
        if (http_code < 200 || http_code >= 400) {
            LOG_ERR("%s: invalid http status code received: %ld\n", __func__, http_code);
            return false;
        }

        // Causes file to be closed explicitly here before we rename it.
        outfile.reset();

        // Write the updated JSON metadata file.
        metadata.update({
            {"url", url},
            {"etag", headers.etag},
            {"lastModified", headers.last_modified}
        });
        std::ofstream(metadata_path) << metadata.dump(4);
        LOG_INF("%s: file metadata saved: %s\n", __func__, metadata_path.c_str());

        if (rename(path_temporary.c_str(), path.c_str()) != 0) {
            LOG_ERR("%s: unable to rename file: %s to %s\n", __func__, path_temporary.c_str(), path.c_str());
            return false;
        }
    }

    return true;
}